

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O2

void xercesc_4_0::XMLString::upperCaseASCII(XMLCh *toUpperCase)

{
  XMLCh XVar1;
  
  if (toUpperCase != (XMLCh *)0x0) {
    for (; XVar1 = *toUpperCase, XVar1 != L'\0'; toUpperCase = toUpperCase + 1) {
      if ((ushort)(XVar1 + L'ﾟ') < 0x1a) {
        *toUpperCase = XVar1 + L'￠';
      }
    }
  }
  return;
}

Assistant:

void XMLString::upperCaseASCII(XMLCh* const toUpperCase)
{
    XMLCh* psz1 = toUpperCase;

    if (!psz1)
        return;

    while (*psz1) {
        if (*psz1 >= chLatin_a && *psz1 <= chLatin_z)
            *psz1 = *psz1 - chLatin_a + chLatin_A;

        psz1++;
    }
}